

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# take_any_args.hpp
# Opt level: O0

Elements * __thiscall
ftxui::
unpack<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
          (Elements *__return_storage_ptr__,ftxui *this,shared_ptr<ftxui::Node> *args,
          shared_ptr<ftxui::Node> *args_1,shared_ptr<ftxui::Node> *args_2)

{
  shared_ptr<ftxui::Node> local_70;
  shared_ptr<ftxui::Node> local_60 [2];
  shared_ptr<ftxui::Node> local_40;
  undefined1 local_29;
  shared_ptr<ftxui::Node> *local_28;
  shared_ptr<ftxui::Node> *args_local_2;
  shared_ptr<ftxui::Node> *args_local_1;
  shared_ptr<ftxui::Node> *args_local;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *vec;
  
  local_29 = 0;
  local_28 = args_1;
  args_local_2 = args;
  args_local_1 = (shared_ptr<ftxui::Node> *)this;
  args_local = (shared_ptr<ftxui::Node> *)__return_storage_ptr__;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (__return_storage_ptr__);
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_40,(shared_ptr<ftxui::Node> *)this);
  Merge<std::shared_ptr<ftxui::Node>>(__return_storage_ptr__,&local_40);
  std::shared_ptr<ftxui::Node>::shared_ptr(local_60,args);
  Merge<std::shared_ptr<ftxui::Node>>(__return_storage_ptr__,local_60);
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_70,args_1);
  Merge<std::shared_ptr<ftxui::Node>>(__return_storage_ptr__,&local_70);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_70);
  std::shared_ptr<ftxui::Node>::~shared_ptr(local_60);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Elements unpack(Args... args) {
  std::vector<Element> vec;
  (Merge(vec, std::move(args)), ...);
  return vec;
}